

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

bool __thiscall
VertexAttrib64Bit::GetVertexAttribTest::verifyResults
          (GetVertexAttribTest *this,GLuint index,GLenum pname,GLint expected_value)

{
  TestLog *this_00;
  GLenum GVar1;
  MessageBuilder *pMVar2;
  int local_9e4;
  MessageBuilder local_9e0;
  MessageBuilder local_860;
  MessageBuilder local_6e0;
  char *local_560;
  MessageBuilder local_558;
  MessageBuilder local_3d8;
  char *local_258;
  MessageBuilder local_250;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_91;
  string local_90;
  LogSection local_70;
  GLdouble local_30;
  GLdouble params_getVertexAttribLdv;
  GLint params_getVertexAttribiv;
  GLint expected_value_local;
  GLenum pname_local;
  GLuint index_local;
  GetVertexAttribTest *this_local;
  
  params_getVertexAttribLdv._0_4_ = 0;
  local_30 = 0.0;
  params_getVertexAttribLdv._4_4_ = expected_value;
  params_getVertexAttribiv = pname;
  expected_value_local = index;
  _pname_local = this;
  (*(this->super_Base).gl.getVertexAttribiv)(index,pname,(GLint *)&params_getVertexAttribLdv);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"GetVertexAttribiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x448);
  (*(this->super_Base).gl.getVertexAttribLdv)
            (expected_value_local,params_getVertexAttribiv,&local_30);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"GetVertexAttribLdv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,1099);
  if (((params_getVertexAttribLdv._4_4_ != params_getVertexAttribLdv._0_4_) ||
      ((double)params_getVertexAttribLdv._4_4_ != local_30)) ||
     (NAN((double)params_getVertexAttribLdv._4_4_) || NAN(local_30))) {
    this_00 = (this->super_Base).m_log;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Error",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    tcu::LogSection::LogSection(&local_70,&local_90,&local_c8);
    tcu::TestLog::operator<<(this_00,&local_70);
    tcu::LogSection::~LogSection(&local_70);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    tcu::TestLog::operator<<
              (&local_250,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_250,(char (*) [19])0x2c69d48);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&expected_value_local);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])"/* index */, ");
    local_258 = glu::getVertexAttribParameterNameName(params_getVertexAttribiv);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_258);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])"/* pname */)");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_250);
    tcu::TestLog::operator<<
              (&local_3d8,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_3d8,(char (*) [9])0x2a0bcc6);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)&params_getVertexAttribLdv);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3d8);
    tcu::TestLog::operator<<
              (&local_558,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_558,(char (*) [20])0x2c69ced);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&expected_value_local);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])"/* index */, ");
    local_560 = glu::getVertexAttribParameterNameName(params_getVertexAttribiv);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_560);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [13])"/* pname */)");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_558);
    tcu::TestLog::operator<<
              (&local_6e0,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_6e0,(char (*) [9])0x2a0bcc6);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_30);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_6e0);
    tcu::TestLog::operator<<
              (&local_860,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_860,(char (*) [11])0x2af3820);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(int *)((long)&params_getVertexAttribLdv + 4));
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_860);
    tcu::TestLog::operator<<
              (&local_9e0,(this->super_Base).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_9e0,(char (*) [7])0x2a28b75);
    pMVar2 = tcu::MessageBuilder::operator<<
                       (pMVar2,(char (*) [135])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                       );
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])"@");
    local_9e4 = 0x45d;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_9e4);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_9e0);
    tcu::TestLog::operator<<((this->super_Base).m_log,(EndSectionToken *)&tcu::TestLog::EndSection);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GetVertexAttribTest::verifyResults(GLuint index, GLenum pname, GLint expected_value) const
{
	GLint	params_getVertexAttribiv  = 0;
	GLdouble params_getVertexAttribLdv = 0.0;

	gl.getVertexAttribiv(index, pname, &params_getVertexAttribiv);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribiv");

	gl.getVertexAttribLdv(index, pname, &params_getVertexAttribLdv);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribLdv");

	if ((expected_value != params_getVertexAttribiv) || (expected_value != params_getVertexAttribLdv))
	{
		m_log << tcu::TestLog::Section("Error", "");

		m_log << tcu::TestLog::Message << "GetVertexAttribiv(" << index << "/* index */, "
			  << glu::getVertexAttribParameterNameName(pname) << "/* pname */)" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "Result: " << params_getVertexAttribiv << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "GetVertexAttribLdv(" << index << "/* index */, "
			  << glu::getVertexAttribParameterNameName(pname) << "/* pname */)" << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "Result: " << params_getVertexAttribLdv << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "Expected: " << expected_value << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::Message << "File: " << __FILE__ << "@" << __LINE__ << tcu::TestLog::EndMessage;

		m_log << tcu::TestLog::EndSection;

		return false;
	}

	return true;
}